

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.hpp
# Opt level: O2

string * __thiscall
duckdb::ExtensionHelper::FindExtensionInEntries<8ul>
          (string *__return_storage_ptr__,ExtensionHelper *this,string *name,
          ExtensionEntry (*entries) [8])

{
  bool bVar1;
  ExtensionEntry *__lhs;
  string lcase;
  allocator local_41;
  string local_40;
  
  StringUtil::Lower(&local_40,(string *)this);
  __lhs = ::std::
          __find_if<duckdb::ExtensionEntry_const*,__gnu_cxx::__ops::_Iter_pred<duckdb::ExtensionHelper::FindExtensionInEntries<8ul>(std::__cxx11::string_const&,duckdb::ExtensionEntry_const(&)[8ul])::_lambda(duckdb::ExtensionEntry_const&)_1_>>
                    (name,(ExtensionEntry *)(name + 0x18),&local_40);
  if (__lhs != (ExtensionEntry *)(name + 0x18)) {
    bVar1 = ::std::operator==(__lhs->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_40);
    if (bVar1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,__lhs->extension,&local_41);
      goto LAB_019a66f6;
    }
  }
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,&local_41);
LAB_019a66f6:
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static string FindExtensionInEntries(const string &name, const ExtensionEntry (&entries)[N]) {
		auto lcase = StringUtil::Lower(name);

		auto it =
		    std::find_if(entries, entries + N, [&](const ExtensionEntry &element) { return element.name == lcase; });

		if (it != entries + N && it->name == lcase) {
			return it->extension;
		}
		return "";
	}